

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Expression> __thiscall Parser::comparison(Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  undefined1 local_40 [32];
  __shared_ptr<BinaryOperator,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  term(this);
  bVar1 = match(in_RSI,LThan);
  if (bVar1) {
    consume(in_RSI);
    std::make_shared<LessThan>();
    comparison((Parser *)local_40);
    std::
    make_shared<BinaryOperator,std::shared_ptr<LessThan>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
              ((shared_ptr<LessThan> *)&local_20,(shared_ptr<Expression> *)(local_40 + 0x10),
               (shared_ptr<Expression> *)this);
  }
  else {
    bVar1 = match(in_RSI,LThanEqu);
    if (bVar1) {
      consume(in_RSI);
      std::make_shared<LessThanOrEqual>();
      comparison((Parser *)local_40);
      std::
      make_shared<BinaryOperator,std::shared_ptr<LessThanOrEqual>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
                ((shared_ptr<LessThanOrEqual> *)&local_20,
                 (shared_ptr<Expression> *)(local_40 + 0x10),(shared_ptr<Expression> *)this);
    }
    else {
      bVar1 = match(in_RSI,GThanEqu);
      if (bVar1) {
        consume(in_RSI);
        std::make_shared<GreaterThan>();
        comparison((Parser *)local_40);
        std::
        make_shared<BinaryOperator,std::shared_ptr<GreaterThan>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
                  ((shared_ptr<GreaterThan> *)&local_20,(shared_ptr<Expression> *)(local_40 + 0x10),
                   (shared_ptr<Expression> *)this);
      }
      else {
        bVar1 = match(in_RSI,GThanEqu);
        _Var2._M_pi = extraout_RDX;
        if (!bVar1) goto LAB_0010da0b;
        consume(in_RSI);
        std::make_shared<GreaterThanOrEqual>();
        comparison((Parser *)local_40);
        std::
        make_shared<BinaryOperator,std::shared_ptr<GreaterThanOrEqual>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
                  ((shared_ptr<GreaterThanOrEqual> *)&local_20,
                   (shared_ptr<Expression> *)(local_40 + 0x10),(shared_ptr<Expression> *)this);
      }
    }
  }
  std::__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Expression,(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 0x18));
  _Var2._M_pi = extraout_RDX_00;
LAB_0010da0b:
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::comparison() {
    ptr<Expression> expr = term();

    if(match(TokenType::LThan)) {
        consume();
        expr = make<BinaryOperator>(make<LessThan>(), expr, comparison());
    } else if(match(TokenType::LThanEqu)) {
        consume();
        expr = make<BinaryOperator>(make<LessThanOrEqual>(), expr, comparison());
    } else if(match(TokenType::GThanEqu)) {
        consume();
        expr = make<BinaryOperator>(make<GreaterThan>(), expr, comparison());
    } else if(match(TokenType::GThanEqu)) {
        consume();
        expr = make<BinaryOperator>(make<GreaterThanOrEqual>(), expr, comparison());
    }

    return expr;
}